

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffphext(fitsfile *fptr,char *xtensionx,int bitpix,int naxis,long *naxes,LONGLONG pcount,
           LONGLONG gcount,int *status)

{
  int local_16c;
  char local_168 [4];
  int ii;
  char xtension [71];
  char local_118 [8];
  char name [20];
  char local_f8 [8];
  char comm [81];
  char local_98 [8];
  char message [81];
  LONGLONG pcount_local;
  long *naxes_local;
  int naxis_local;
  int bitpix_local;
  char *xtensionx_local;
  fitsfile *fptr_local;
  
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (*status < 1) {
    if (fptr->Fptr->headend == fptr->Fptr->headstart[fptr->Fptr->curhdu]) {
      if ((naxis < 0) || (999 < naxis)) {
        snprintf(local_98,0x51,"Illegal value for NAXIS keyword: %d",(ulong)(uint)naxis);
        ffpmsg(local_98);
        *status = 0xd4;
        fptr_local._4_4_ = 0xd4;
      }
      else {
        local_168[0] = '\0';
        strncat(local_168,xtensionx,0x46);
        ffpkys(fptr,"XTENSION",local_168,"extension type",status);
        ffpkyj(fptr,"BITPIX",(long)bitpix,"number of bits per data pixel",status);
        ffpkyj(fptr,"NAXIS",(long)naxis,"number of data axes",status);
        strcpy(local_f8,"length of data axis ");
        for (local_16c = 0; local_16c < naxis; local_16c = local_16c + 1) {
          if (naxes[local_16c] < 0) {
            snprintf(local_98,0x51,"Illegal negative value for NAXIS%d keyword: %.0f",
                     (double)naxes[local_16c],(ulong)(local_16c + 1));
            ffpmsg(local_98);
            *status = 0xd5;
            return 0xd5;
          }
          snprintf(comm + 0xc,0x3d,"%d",(ulong)(local_16c + 1));
          ffkeyn("NAXIS",local_16c + 1,local_118,status);
          ffpkyj(fptr,local_118,naxes[local_16c],local_f8,status);
        }
        ffpkyj(fptr,"PCOUNT",pcount," ",status);
        ffpkyj(fptr,"GCOUNT",gcount," ",status);
        if (0 < *status) {
          ffpmsg("Failed to write extension header keywords (ffphext)");
        }
        fptr_local._4_4_ = *status;
      }
    }
    else {
      *status = 0xc9;
      fptr_local._4_4_ = 0xc9;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffphext(fitsfile *fptr,  /* I - FITS file pointer                       */
           const char *xtensionx,   /* I - value for the XTENSION keyword          */
           int bitpix,       /* I - value for the BIXPIX keyword            */
           int naxis,        /* I - value for the NAXIS keyword             */
           long naxes[],     /* I - value for the NAXISn keywords           */
           LONGLONG pcount,  /* I - value for the PCOUNT keyword            */
           LONGLONG gcount,  /* I - value for the GCOUNT keyword            */
           int *status)      /* IO - error status                           */
/*
  Put required Header keywords into a conforming extension:
*/
{
    char message[FLEN_ERRMSG],comm[81], name[20], xtension[FLEN_VALUE];
    int ii;
 
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (*status > 0)
        return(*status);
    else if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);

    if (naxis < 0 || naxis > 999)
    {
        snprintf(message,FLEN_ERRMSG,
        "Illegal value for NAXIS keyword: %d", naxis);
        ffpmsg(message);
        return(*status = BAD_NAXIS);
    }

    xtension[0] = '\0';
    strncat(xtension, xtensionx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", xtension, "extension type", status);
    ffpkyj(fptr, "BITPIX",   bitpix,   "number of bits per data pixel", status);
    ffpkyj(fptr, "NAXIS",    naxis,    "number of data axes", status);

    strcpy(comm, "length of data axis ");
    for (ii = 0; ii < naxis; ii++)
    {
        if (naxes[ii] < 0)
        {
            snprintf(message,FLEN_ERRMSG,
            "Illegal negative value for NAXIS%d keyword: %.0f", ii + 1, (double) (naxes[ii]));
            ffpmsg(message);
            return(*status = BAD_NAXES);
        }

        snprintf(&comm[20], 61, "%d", ii + 1);
        ffkeyn("NAXIS", ii + 1, name, status);
        ffpkyj(fptr, name, naxes[ii], comm, status);
    }


    ffpkyj(fptr, "PCOUNT", pcount, " ", status);
    ffpkyj(fptr, "GCOUNT", gcount, " ", status);

    if (*status > 0)
        ffpmsg("Failed to write extension header keywords (ffphext)");

    return(*status);
}